

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-decimal128.c
# Opt level: O3

void bson_decimal128_to_string(bson_decimal128_t *dec,char *str)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int *__s;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  undefined1 *puVar11;
  char *pcVar12;
  uint uVar13;
  long lVar15;
  bool bVar16;
  uint32_t significand [36];
  ulong local_e0;
  ulong local_d8;
  char *local_d0;
  int local_c8;
  int local_c4 [34];
  undefined1 local_3c [12];
  ulong uVar14;
  
  __s = &local_c8;
  memset(__s,0,0x90);
  uVar5 = dec->high;
  pcVar12 = str;
  if ((long)uVar5 < 0) {
    pcVar12 = str + 1;
    *str = '-';
    uVar5 = dec->high;
  }
  uVar3 = dec->low;
  uVar13 = (uint)(uVar5 >> 0x20);
  if ((~uVar13 & 0x60000000) == 0) {
    uVar7 = uVar13 >> 0x1a & 0x1f;
    if (uVar7 == 0x1f) {
      builtin_strncpy(str,"NaN",4);
      return;
    }
    if (uVar7 == 0x1e) {
      builtin_strncpy(pcVar12,"Infinity",9);
      return;
    }
    uVar7 = uVar13 >> 0xf;
    uVar8 = uVar13 >> 0xe & 1 | 8;
  }
  else {
    uVar8 = uVar13 >> 0xe & 7;
    uVar7 = uVar13 >> 0x11;
  }
  uVar7 = uVar7 & 0x3fff;
  uVar13 = uVar8 << 0xe | uVar13 & 0x3fff;
  uVar14 = (ulong)uVar13;
  uVar4 = uVar3 << 0x20 | uVar3 >> 0x20;
  if ((uVar8 < 8) &&
     ((int)uVar3 != 0 || (((int)(uVar3 >> 0x20) != 0 || (int)uVar5 != 0) || uVar13 != 0))) {
    lVar9 = 3;
    puVar11 = local_3c;
    do {
      local_e0 = uVar14 & 0xffffffff | uVar5 << 0x20;
      local_d8 = uVar4;
      if (local_e0 == 0 && uVar4 == 0) {
        uVar5 = 0;
        uVar4 = 0;
        uVar14 = 0;
      }
      else {
        lVar15 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 << 0x20 | (ulong)*(uint *)((long)&local_e0 + lVar15 * 4);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar3;
          uVar5 = SUB168(auVar1 * ZEXT816(0x112e0be826d694b3),8) >> 0x1a;
          *(int *)((long)&local_e0 + lVar15 * 4) = (int)uVar5;
          uVar3 = uVar3 + uVar5 * -1000000000;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        uVar5 = local_e0 >> 0x20;
        uVar4 = local_d8;
        uVar14 = local_e0;
        if (uVar3 != 0) {
          lVar15 = 0;
          do {
            iVar2 = (int)uVar3;
            uVar6 = uVar3 & 0xffffffff;
            uVar3 = uVar6 / 10;
            *(int *)(puVar11 + lVar15 * 4) = iVar2 + (int)(uVar6 / 10) * -10;
            lVar15 = lVar15 + -1;
          } while (lVar15 != -9);
        }
      }
      puVar11 = puVar11 + -0x24;
      bVar16 = lVar9 != 0;
      lVar9 = lVar9 + -1;
    } while (bVar16);
    uVar13 = 0x24;
    iVar2 = local_c8;
    local_d0 = str;
    if (local_c8 == 0) {
      uVar13 = 0x24;
      __s = &local_c8;
      do {
        uVar13 = uVar13 - 1;
        iVar2 = __s[1];
        __s = __s + 1;
      } while (iVar2 == 0);
    }
  }
  else {
    local_c8 = 0;
    uVar13 = 1;
    iVar2 = 0;
  }
  if ((0x1820 < uVar7) || ((int)(uVar13 + (uVar7 - 0x1820) + -1) < -6)) {
    *pcVar12 = (char)iVar2 + '0';
    if (uVar13 - 1 == 0) {
      pcVar10 = pcVar12 + 1;
    }
    else {
      pcVar10 = pcVar12 + 2;
      pcVar12[1] = '.';
      if ((long)pcVar10 - (long)str < 0x24) {
        uVar5 = 0;
        do {
          pcVar10[uVar5] = (char)__s[uVar5 + 1] + '0';
          uVar3 = uVar5 + 1;
          if (uVar13 - 1 <= uVar3) break;
          lVar9 = uVar5 + (3 - (long)str);
          uVar5 = uVar3;
        } while ((long)(pcVar12 + lVar9) < 0x24);
        pcVar10 = pcVar10 + uVar3;
      }
    }
    *pcVar10 = 'E';
    bson_snprintf(pcVar10 + 1,6,"%+d");
    return;
  }
  if (0x181f < uVar7) {
    if ((long)pcVar12 - (long)str < 0x24 && uVar13 != 0) {
      uVar5 = 0;
      do {
        pcVar12[uVar5] = (char)__s[uVar5] + '0';
        uVar3 = uVar5 + 1;
        if (uVar13 <= uVar3) break;
        lVar9 = uVar5 + ((long)pcVar12 - (long)str) + 1;
        uVar5 = uVar3;
      } while (lVar9 < 0x24);
      pcVar12 = pcVar12 + uVar3;
    }
    *pcVar12 = '\0';
    return;
  }
  uVar8 = (uVar7 - 0x1820) + uVar13;
  if ((int)uVar8 < 1) {
    *pcVar12 = '0';
    pcVar12 = pcVar12 + 1;
  }
  else {
    if (0x2a < (long)pcVar12 - (long)str) {
      *pcVar12 = '.';
      pcVar10 = pcVar12 + 1;
      goto LAB_0010f388;
    }
    lVar9 = 0;
    uVar5 = 0;
    do {
      pcVar12[uVar5] = (char)__s[uVar5] + '0';
      uVar3 = uVar5 + 1;
      lVar9 = lVar9 + 4;
      if (uVar8 <= uVar3) break;
      lVar15 = uVar5 + ((long)pcVar12 - (long)str) + 1;
      uVar5 = uVar3;
    } while (lVar15 < 0x2b);
    pcVar12 = pcVar12 + uVar3;
    __s = (int *)((long)__s + lVar9);
  }
  *pcVar12 = '.';
  pcVar10 = pcVar12 + 1;
  if ((int)uVar8 < 0) {
    uVar5 = (ulong)(0x181f - (uVar7 + uVar13));
    memset(pcVar10,0x30,uVar5 + 1);
    pcVar10 = pcVar12 + uVar5 + 2;
    uVar8 = 0;
  }
LAB_0010f388:
  if ((uVar13 - uVar8 != 0) && ((long)pcVar10 - (long)str < 0x2b)) {
    uVar5 = 0;
    do {
      pcVar10[uVar5] = (char)__s[uVar5] + '0';
      uVar3 = uVar5 + 1;
      if (uVar13 - uVar8 <= uVar3) break;
      lVar9 = uVar5 + ((long)pcVar10 - (long)str) + 1;
      uVar5 = uVar3;
    } while (lVar9 < 0x2b);
    pcVar10 = pcVar10 + uVar3;
  }
  *pcVar10 = '\0';
  return;
}

Assistant:

void
bson_decimal128_to_string (const bson_decimal128_t *dec, /* IN  */
                           char *str)                    /* OUT */
{
   uint32_t COMBINATION_MASK = 0x1f;   /* Extract least significant 5 bits */
   uint32_t EXPONENT_MASK = 0x3fff;    /* Extract least significant 14 bits */
   uint32_t COMBINATION_INFINITY = 30; /* Value of combination field for Inf */
   uint32_t COMBINATION_NAN = 31;      /* Value of combination field for NaN */
   uint32_t EXPONENT_BIAS = 6176;      /* decimal128 exponent bias */

   char *str_out = str;      /* output pointer in string */
   char significand_str[35]; /* decoded significand digits */


   /* Note: bits in this routine are referred to starting at 0, */
   /* from the sign bit, towards the coefficient. */
   uint32_t high;                   /* bits 0 - 31 */
   uint32_t midh;                   /* bits 32 - 63 */
   uint32_t midl;                   /* bits 64 - 95 */
   uint32_t low;                    /* bits 96 - 127 */
   uint32_t combination;            /* bits 1 - 5 */
   uint32_t biased_exponent;        /* decoded biased exponent (14 bits) */
   uint32_t significand_digits = 0; /* the number of significand digits */
   uint32_t significand[36] = {0};  /* the base-10 digits in the significand */
   uint32_t *significand_read = significand; /* read pointer into significand */
   int32_t exponent;                         /* unbiased exponent */
   int32_t scientific_exponent; /* the exponent if scientific notation is
                                 * used */
   bool is_zero = false;        /* true if the number is zero */

   uint8_t significand_msb; /* the most signifcant significand bits (50-46) */
   _bson_uint128_t
      significand128; /* temporary storage for significand decoding */
   size_t i;          /* indexing variables */
   int j, k;

   memset (significand_str, 0, sizeof (significand_str));

   if ((int64_t) dec->high < 0) { /* negative */
      *(str_out++) = '-';
   }

   low = (uint32_t) dec->low, midl = (uint32_t) (dec->low >> 32),
   midh = (uint32_t) dec->high, high = (uint32_t) (dec->high >> 32);

   /* Decode combination field and exponent */
   combination = (high >> 26) & COMBINATION_MASK;

   if (BSON_UNLIKELY ((combination >> 3) == 3)) {
      /* Check for 'special' values */
      if (combination == COMBINATION_INFINITY) { /* Infinity */
         strcpy (str_out, BSON_DECIMAL128_INF);
         return;
      } else if (combination == COMBINATION_NAN) { /* NaN */
         /* str, not str_out, to erase the sign */
         strcpy (str, BSON_DECIMAL128_NAN);
         /* we don't care about the NaN payload. */
         return;
      } else {
         biased_exponent = (high >> 15) & EXPONENT_MASK;
         significand_msb = 0x8 + ((high >> 14) & 0x1);
      }
   } else {
      significand_msb = (high >> 14) & 0x7;
      biased_exponent = (high >> 17) & EXPONENT_MASK;
   }

   exponent = biased_exponent - EXPONENT_BIAS;
   /* Create string of significand digits */

   /* Convert the 114-bit binary number represented by */
   /* (high, midh, midl, low) to at most 34 decimal */
   /* digits through modulo and division. */
   significand128.parts[0] = (high & 0x3fff) + ((significand_msb & 0xf) << 14);
   significand128.parts[1] = midh;
   significand128.parts[2] = midl;
   significand128.parts[3] = low;

   if (significand128.parts[0] == 0 && significand128.parts[1] == 0 &&
       significand128.parts[2] == 0 && significand128.parts[3] == 0) {
      is_zero = true;
   } else if (significand128.parts[0] >= (1 << 17)) {
      /* The significand is non-canonical or zero.
       * In order to preserve compatability with the densely packed decimal
       * format, the maximum value for the significand of decimal128 is
       * 1e34 - 1.  If the value is greater than 1e34 - 1, the IEEE 754
       * standard dictates that the significand is interpreted as zero.
       */
      is_zero = true;
   } else {
      for (k = 3; k >= 0; k--) {
         uint32_t least_digits = 0;
         _bson_uint128_divide1B (
            significand128, &significand128, &least_digits);

         /* We now have the 9 least significant digits (in base 2). */
         /* Convert and output to string. */
         if (!least_digits) {
            continue;
         }

         for (j = 8; j >= 0; j--) {
            significand[k * 9 + j] = least_digits % 10;
            least_digits /= 10;
         }
      }
   }

   /* Output format options: */
   /* Scientific - [-]d.dddE(+/-)dd or [-]dE(+/-)dd */
   /* Regular    - ddd.ddd */

   if (is_zero) {
      significand_digits = 1;
      *significand_read = 0;
   } else {
      significand_digits = 36;
      while (!(*significand_read)) {
         significand_digits--;
         significand_read++;
      }
   }

   scientific_exponent = significand_digits - 1 + exponent;

   /* The scientific exponent checks are dictated by the string conversion
    * specification and are somewhat arbitrary cutoffs.
    *
    * We must check exponent > 0, because if this is the case, the number
    * has trailing zeros.  However, we *cannot* output these trailing zeros,
    * because doing so would change the precision of the value, and would
    * change stored data if the string converted number is round tripped.
    */
   if (scientific_exponent < -6 || exponent > 0) {
      /* Scientific format */
      *(str_out++) = *(significand_read++) + '0';
      significand_digits--;

      if (significand_digits) {
         *(str_out++) = '.';
      }

      for (i = 0; i < significand_digits && (str_out - str) < 36; i++) {
         *(str_out++) = *(significand_read++) + '0';
      }
      /* Exponent */
      *(str_out++) = 'E';
      bson_snprintf (str_out, 6, "%+d", scientific_exponent);
   } else {
      /* Regular format with no decimal place */
      if (exponent >= 0) {
         for (i = 0; i < significand_digits && (str_out - str) < 36; i++) {
            *(str_out++) = *(significand_read++) + '0';
         }
         *str_out = '\0';
      } else {
         int32_t radix_position = significand_digits + exponent;

         if (radix_position > 0) { /* non-zero digits before radix */
            for (i = 0;
                 i < radix_position && (str_out - str) < BSON_DECIMAL128_STRING;
                 i++) {
               *(str_out++) = *(significand_read++) + '0';
            }
         } else { /* leading zero before radix point */
            *(str_out++) = '0';
         }

         *(str_out++) = '.';
         while (radix_position++ < 0) { /* add leading zeros after radix */
            *(str_out++) = '0';
         }

         for (i = 0;
              (i < significand_digits - BSON_MAX (radix_position - 1, 0)) &&
              (str_out - str) < BSON_DECIMAL128_STRING;
              i++) {
            *(str_out++) = *(significand_read++) + '0';
         }
         *str_out = '\0';
      }
   }
}